

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O0

void set_fwd_txfm_non_scale_range(TXFM_2D_FLIP_CFG *cfg)

{
  int iVar1;
  int iVar2;
  int8_t *piVar3;
  int8_t *piVar4;
  long in_RDI;
  int i_1;
  int stage_num_row;
  int8_t *range_mult2_row;
  int i;
  int stage_num_col;
  int8_t *range_mult2_col;
  int local_28;
  int local_18;
  
  memset((void *)(in_RDI + 0x1a),0,0xc);
  memset((void *)(in_RDI + 0x26),0,0xc);
  piVar3 = fwd_txfm_range_mult2_list[*(byte *)(in_RDI + 0x32)];
  iVar1 = *(int *)(in_RDI + 0x34);
  for (local_18 = 0; local_18 < iVar1 && local_18 < 0xc; local_18 = local_18 + 1) {
    *(char *)(in_RDI + 0x1a + (long)local_18) = (char)(piVar3[local_18] + 1 >> 1);
  }
  piVar4 = fwd_txfm_range_mult2_list[*(byte *)(in_RDI + 0x33)];
  iVar2 = *(int *)(in_RDI + 0x38);
  for (local_28 = 0; local_28 < iVar2 && local_28 < 0xc; local_28 = local_28 + 1) {
    *(char *)(in_RDI + 0x26 + (long)local_28) =
         (char)((int)piVar3[iVar1 + -1] + (int)piVar4[local_28] + 1 >> 1);
  }
  return;
}

Assistant:

static inline void set_fwd_txfm_non_scale_range(TXFM_2D_FLIP_CFG *cfg) {
  av1_zero(cfg->stage_range_col);
  av1_zero(cfg->stage_range_row);

  const int8_t *const range_mult2_col =
      fwd_txfm_range_mult2_list[cfg->txfm_type_col];
  const int stage_num_col = cfg->stage_num_col;
  // i < MAX_TXFM_STAGE_NUM will quiet -Wstringop-overflow.
  for (int i = 0; i < stage_num_col && i < MAX_TXFM_STAGE_NUM; ++i)
    cfg->stage_range_col[i] = (range_mult2_col[i] + 1) >> 1;

  const int8_t *const range_mult2_row =
      fwd_txfm_range_mult2_list[cfg->txfm_type_row];
  const int stage_num_row = cfg->stage_num_row;
  // i < MAX_TXFM_STAGE_NUM will quiet -Wstringop-overflow.
  for (int i = 0; i < stage_num_row && i < MAX_TXFM_STAGE_NUM; ++i) {
    cfg->stage_range_row[i] =
        (range_mult2_col[stage_num_col - 1] + range_mult2_row[i] + 1) >> 1;
  }
}